

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infozip.cpp
# Opt level: O0

uint mem_read(void *handle,char *target,uint size)

{
  uint uVar1;
  void *__src;
  ulg left;
  char *rp;
  char *wp;
  BufData *bufdata;
  uint size_local;
  char *target_local;
  void *handle_local;
  
  __src = (void *)(*handle + (ulong)*(uint *)((long)handle + 0xc));
  if ((__src < (void *)(*(long *)(*(long *)((long)handle + 0x10) + 0x1b0e0) +
                        (ulong)*(uint *)(*(long *)((long)handle + 0x10) + 0x1b0e8) + 0x8000)) &&
     (*(ulong *)(*(long *)((long)handle + 0x10) + 0x1b0e0) < *handle)) {
    *(undefined1 *)((long)handle + 0x18) = 1;
    handle_local._4_4_ = 0;
  }
  else if (*(uint *)((long)handle + 0xc) < *(uint *)((long)handle + 8)) {
    uVar1 = *(int *)((long)handle + 8) - *(int *)((long)handle + 0xc);
    bufdata._4_4_ = size;
    if (uVar1 < size) {
      bufdata._4_4_ = uVar1;
    }
    memcpy(target,__src,(ulong)bufdata._4_4_);
    *(uint *)((long)handle + 0xc) = bufdata._4_4_ + *(int *)((long)handle + 0xc);
    handle_local._4_4_ = bufdata._4_4_;
  }
  else {
    handle_local._4_4_ = 0;
  }
  return handle_local._4_4_;
}

Assistant:

local unsigned mem_read(void* handle, char* target, unsigned size)
{
    BufData* bufdata = (BufData*)handle;

    char* wp = bufdata->zid->out_buf + bufdata->zid->out_offset;
    char* rp = bufdata->in_buf + bufdata->in_offset;

    // This will normally never trigger
    if ((wp + 32768 > rp) && (bufdata->zid->out_buf < bufdata->in_buf)) {
        bufdata->fail = true;
        return 0;
    }

    if (bufdata->in_offset >= bufdata->in_size)
        return 0;
    ulg left = bufdata->in_size - bufdata->in_offset;
    if (left < (ulg)size)
        size = left;
    memcpy(target, rp, size);
    bufdata->in_offset += size;

    return size;
}